

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

bool __thiscall QListModel::clearItemData(QListModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  long lVar2;
  QListWidgetItemPrivate *pQVar3;
  char cVar4;
  QWidgetItemData *pQVar5;
  QWidgetItemData *pQVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QAbstractItemModel::checkIndex(this,index,1);
  if (cVar4 == '\0') goto LAB_0057a896;
  pQVar3 = (this->items).d.ptr[index->r]->d;
  pQVar5 = (pQVar3->values).d.ptr;
  lVar9 = (pQVar3->values).d.size;
  pQVar1 = pQVar5 + lVar9;
  lVar7 = lVar9 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    pQVar6 = pQVar5 + 2;
    do {
      if (3 < *(ulong *)&pQVar6[-2].value.d.field_0x18) {
        pQVar6 = pQVar6 + -2;
        goto LAB_0057a842;
      }
      if (3 < *(ulong *)&pQVar6[-1].value.d.field_0x18) {
        pQVar6 = pQVar6 + -1;
        goto LAB_0057a842;
      }
      if (3 < *(ulong *)&(pQVar6->value).d.field_0x18) goto LAB_0057a842;
      if (3 < *(ulong *)&pQVar6[1].value.d.field_0x18) {
        pQVar6 = pQVar6 + 1;
        goto LAB_0057a842;
      }
      lVar8 = lVar8 + -1;
      pQVar6 = pQVar6 + 4;
    } while (1 < lVar8);
    lVar9 = (lVar9 * 0x28 + lVar7 * -0xa0 >> 3) * -0x3333333333333333;
    pQVar5 = pQVar5 + lVar7 * 4;
  }
  if (lVar9 == 1) {
LAB_0057a824:
    pQVar6 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar6 = pQVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_0057a819:
    pQVar6 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar5 = pQVar5 + 1;
      goto LAB_0057a824;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_0057a896;
    pQVar6 = pQVar5;
    if (*(ulong *)&(pQVar5->value).d.field_0x18 < 4) {
      pQVar5 = pQVar5 + 1;
      goto LAB_0057a819;
    }
  }
LAB_0057a842:
  if (pQVar6 != pQVar1) {
    QList<QWidgetItemData>::clear(&pQVar3->values);
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
  }
LAB_0057a896:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QListModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QListWidgetItem *item = items.at(index.row());
    const auto beginIter = item->d->values.cbegin();
    const auto endIter = item->d->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    item->d->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}